

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O2

uint8_t av1_drl_ctx(uint16_t *ref_mv_weight,int ref_idx)

{
  uint8_t uVar1;
  
  uVar1 = (ref_mv_weight[(long)ref_idx + 1] < 0x280) * '\x02';
  if (0x27f < ref_mv_weight[(uint)ref_idx]) {
    uVar1 = ref_mv_weight[(long)ref_idx + 1] < 0x280;
  }
  return uVar1;
}

Assistant:

static inline uint8_t av1_drl_ctx(const uint16_t *ref_mv_weight, int ref_idx) {
  if (ref_mv_weight[ref_idx] >= REF_CAT_LEVEL &&
      ref_mv_weight[ref_idx + 1] >= REF_CAT_LEVEL)
    return 0;

  if (ref_mv_weight[ref_idx] >= REF_CAT_LEVEL &&
      ref_mv_weight[ref_idx + 1] < REF_CAT_LEVEL)
    return 1;

  if (ref_mv_weight[ref_idx] < REF_CAT_LEVEL &&
      ref_mv_weight[ref_idx + 1] < REF_CAT_LEVEL)
    return 2;

  return 0;
}